

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateIfElse(ExpressionEvalContext *ctx,ExprIfElse *expression)

{
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  ExprBase *pEVar4;
  long local_30;
  longlong result;
  ExprBase *condition;
  ExprIfElse *expression_local;
  ExpressionEvalContext *ctx_local;
  
  condition = &expression->super_ExprBase;
  expression_local = (ExprIfElse *)ctx;
  ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pEVar4 = condition;
  if ((*ppSVar2)->targetYield == 0) {
    bVar1 = AddInstruction((ExpressionEvalContext *)expression_local);
    if (bVar1) {
      result = (longlong)
               Evaluate((ExpressionEvalContext *)expression_local,
                        (ExprBase *)condition[1]._vptr_ExprBase);
      if ((ExprBase *)result == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        bVar1 = TryTakeLong((ExprBase *)result,&local_30);
        if (bVar1) {
          if (local_30 == 0) {
            if ((condition[1].source != (SynBase *)0x0) &&
               (pEVar4 = Evaluate((ExpressionEvalContext *)expression_local,
                                  (ExprBase *)condition[1].source), pEVar4 == (ExprBase *)0x0)) {
              return (ExprBase *)0x0;
            }
          }
          else {
            pEVar4 = Evaluate((ExpressionEvalContext *)expression_local,
                              *(ExprBase **)&condition[1].typeID);
            if (pEVar4 == (ExprBase *)0x0) {
              return (ExprBase *)0x0;
            }
          }
          pEVar4 = condition;
          pEVar3 = &ExpressionContext::get<ExprVoid>
                              ((ExpressionContext *)
                               (expression_local->super_ExprBase)._vptr_ExprBase)->super_ExprBase;
          ExprVoid::ExprVoid((ExprVoid *)pEVar3,condition->source,
                             (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
          ctx_local = (ExpressionEvalContext *)CheckType(pEVar4,pEVar3);
        }
        else {
          ctx_local = (ExpressionEvalContext *)
                      Report((ExpressionEvalContext *)expression_local,
                             "ERROR: failed to evaluate \'if\' condition");
        }
      }
    }
    else {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
  }
  else {
    pEVar3 = &ExpressionContext::get<ExprVoid>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
              super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar3,condition->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    ctx_local = (ExpressionEvalContext *)CheckType(pEVar4,pEVar3);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateIfElse(ExpressionEvalContext &ctx, ExprIfElse *expression)
{
	if(ctx.stackFrames.back()->targetYield)
		return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *condition = Evaluate(ctx, expression->condition);

	if(!condition)
		return NULL;

	long long result;
	if(!TryTakeLong(condition, result))
		return Report(ctx, "ERROR: failed to evaluate 'if' condition");

	if(result)
	{
		if(!Evaluate(ctx, expression->trueBlock))
			return NULL;
	}
	else if(expression->falseBlock)
	{
		if(!Evaluate(ctx, expression->falseBlock))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}